

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rm_manager.cc
# Opt level: O0

RC __thiscall RM_Manager::OpenFile(RM_Manager *this,char *fileName,RM_FileHandle *fileHandle)

{
  RC RVar1;
  RC rc2;
  RM_FileHeader *header;
  char *pData;
  undefined1 local_70 [4];
  PageNum page;
  PF_PageHandle ph;
  undefined1 local_50 [8];
  PF_FileHandle fh;
  RC rc;
  RM_FileHandle *fileHandle_local;
  char *fileName_local;
  RM_Manager *this_local;
  
  if (fileName == (char *)0x0) {
    this_local._4_4_ = 0x6f;
  }
  else if ((fileHandle->openedFH & 1U) == 1) {
    this_local._4_4_ = 0x6b;
  }
  else {
    PF_FileHandle::PF_FileHandle((PF_FileHandle *)local_50);
    fh._28_4_ = PF_Manager::OpenFile(this->pfm,fileName,(PF_FileHandle *)local_50);
    if (fh._28_4_ == 0) {
      PF_PageHandle::PF_PageHandle((PF_PageHandle *)local_70);
      fh._28_4_ = PF_FileHandle::GetFirstPage((PF_FileHandle *)local_50,(PF_PageHandle *)local_70);
      if ((fh._28_4_ == 0) &&
         (RVar1 = PF_PageHandle::GetPageNum((PF_PageHandle *)local_70,(PageNum *)((long)&pData + 4))
         , RVar1 == 0)) {
        PF_PageHandle::GetData((PF_PageHandle *)local_70,(char **)&header);
        fh._28_4_ = SetUpFH(this,fileHandle,(PF_FileHandle *)local_50,header);
        this_local._4_4_ = PF_FileHandle::UnpinPage((PF_FileHandle *)local_50,pData._4_4_);
        if (this_local._4_4_ == 0) {
          if (fh._28_4_ != 0) {
            PF_Manager::CloseFile(this->pfm,(PF_FileHandle *)local_50);
          }
          this_local._4_4_ = fh._28_4_;
        }
      }
      else {
        PF_FileHandle::UnpinPage((PF_FileHandle *)local_50,pData._4_4_);
        PF_Manager::CloseFile(this->pfm,(PF_FileHandle *)local_50);
        this_local._4_4_ = fh._28_4_;
      }
      ph.pPageData._0_4_ = 1;
      PF_PageHandle::~PF_PageHandle((PF_PageHandle *)local_70);
    }
    else {
      ph.pPageData._0_4_ = 1;
      this_local._4_4_ = fh._28_4_;
    }
    PF_FileHandle::~PF_FileHandle((PF_FileHandle *)local_50);
  }
  return this_local._4_4_;
}

Assistant:

RC RM_Manager::OpenFile   (const char *fileName, RM_FileHandle &fileHandle){
  if(fileName == NULL)
    return (RM_BADFILENAME);
  // if the filehandle is associated with another open file. exit immediately
  if(fileHandle.openedFH == true)
    return (RM_INVALIDFILEHANDLE);

  RC rc;
  // Open the file
  PF_FileHandle fh;
  if((rc = pfm.OpenFile(fileName, fh)))
    return (rc);

  // Gets the first page, and uses it to set up the header in fileHandle
  PF_PageHandle ph;
  PageNum page;
  if((rc = fh.GetFirstPage(ph)) || (ph.GetPageNum(page))){
    fh.UnpinPage(page);
    pfm.CloseFile(fh);
    return (rc);
  }
  char *pData;
  ph.GetData(pData);
  struct RM_FileHeader * header = (struct RM_FileHeader *) pData;

  // set up and validate the header of this file
  rc = SetUpFH(fileHandle, fh, header);

  // Unpin the header page
  RC rc2;
  if((rc2 = fh.UnpinPage(page)))
    return (rc2);

  // If any errors occured, close the file!
  if(rc != 0){
    pfm.CloseFile(fh);
  }
  return (rc); 
}